

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O3

string * __thiscall viface::VIface::getName_abi_cxx11_(string *__return_storage_ptr__,VIface *this)

{
  _Head_base<0UL,_viface::VIfaceImpl_*,_false> _Var1;
  long lVar2;
  
  _Var1._M_head_impl =
       (this->pimpl)._M_t.
       super___uniq_ptr_impl<viface::VIfaceImpl,_std::default_delete<viface::VIfaceImpl>_>._M_t.
       super__Tuple_impl<0UL,_viface::VIfaceImpl_*,_std::default_delete<viface::VIfaceImpl>_>.
       super__Head_base<0UL,_viface::VIfaceImpl_*,_false>._M_head_impl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *(long *)&((_Var1._M_head_impl)->name)._M_dataplus;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,
             *(size_type *)((long)&(_Var1._M_head_impl)->name + 8) + lVar2);
  return __return_storage_ptr__;
}

Assistant:

string VIface::getName() const {
    return this->pimpl->getName();
}